

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ConcatenationExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConcatenationExpressionSyntax,slang::parsing::Token&,slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>const&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,
          SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *args_1,Token *args_2)

{
  Token closeBrace;
  ConcatenationExpressionSyntax *pCVar1;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *in_RDX;
  ConcatenationExpressionSyntax *in_RSI;
  undefined8 in_RDI;
  Info *unaff_retaddr;
  Token in_stack_00000008;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  BumpAllocator *in_stack_ffffffffffffffd8;
  
  pCVar1 = (ConcatenationExpressionSyntax *)
           allocate(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  closeBrace.info = unaff_retaddr;
  closeBrace.kind = (short)in_RDI;
  closeBrace._2_1_ = (char)((ulong)in_RDI >> 0x10);
  closeBrace.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  closeBrace.rawLen = (int)((ulong)in_RDI >> 0x20);
  slang::syntax::ConcatenationExpressionSyntax::ConcatenationExpressionSyntax
            (in_RSI,in_stack_00000008,in_RDX,closeBrace);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }